

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

FT_Bool tt_face_get_color_glyph_clipbox(TT_Face face,FT_UInt base_glyph,FT_ClipBox *clip_box)

{
  long *plVar1;
  uint uVar2;
  Colr *colr;
  FT_Byte *pFVar3;
  void *pvVar4;
  ulong uVar5;
  FT_Size pFVar6;
  FT_Face_Internal pFVar7;
  long lVar8;
  byte *pbVar9;
  FT_Pos FVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  FT_Pos FVar14;
  FT_Pos FVar15;
  FT_Pos FVar16;
  FT_Vector corners [4];
  FT_Vector local_78;
  FT_Pos local_68;
  FT_Pos FStack_60;
  FT_Pos local_58;
  FT_Pos FStack_50;
  FT_Pos local_48;
  FT_Pos FStack_40;
  
  colr = (Colr *)face->colr;
  if (colr == (Colr *)0x0) {
    return '\0';
  }
  pFVar3 = colr->clip_list;
  if (pFVar3 != (FT_Byte *)0x0) {
    pvVar4 = colr->table;
    uVar5 = colr->table_size;
    if ((pFVar3 <= (FT_Byte *)((long)pvVar4 + (uVar5 - 5))) && (*pFVar3 == '\x01')) {
      uVar2 = *(uint *)(pFVar3 + 1);
      uVar13 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18);
      if (uVar5 / 7 <= uVar13 - 1) {
        return '\0';
      }
      if ((FT_Byte *)((long)pvVar4 + uVar13 * -7 + uVar5) < pFVar3 + 5) {
        return '\0';
      }
      lVar8 = 0;
      do {
        if (((ushort)(*(ushort *)(pFVar3 + lVar8 + 5) << 8 | *(ushort *)(pFVar3 + lVar8 + 5) >> 8)
             <= base_glyph) &&
           (base_glyph <=
            (ushort)(*(ushort *)(pFVar3 + lVar8 + 7) << 8 | *(ushort *)(pFVar3 + lVar8 + 7) >> 8)))
        {
          pbVar9 = pFVar3 + ((ulong)pFVar3[lVar8 + 0xb] |
                            (ulong)((uint)pFVar3[lVar8 + 10] << 8 | (uint)pFVar3[lVar8 + 9] << 0x10)
                            );
          if ((byte *)((long)pvVar4 + (uVar5 - 1)) < pbVar9) {
            return '\0';
          }
          if (pbVar9 + 1 <= (byte *)((long)pvVar4 + (uVar5 - 8)) && *pbVar9 < 3) {
            pFVar6 = (face->root).size;
            lVar11 = (long)(int)(pFVar6->metrics).x_scale;
            lVar8 = ((long)(short)((ushort)pbVar9[1] << 8) | (ulong)pbVar9[2]) * lVar11;
            FVar14 = lVar8 + 0x8000 + (lVar8 >> 0x3f) >> 0x10;
            lVar12 = (long)(int)(pFVar6->metrics).y_scale;
            lVar8 = ((long)(short)((ushort)pbVar9[3] << 8) | (ulong)pbVar9[4]) * lVar12;
            FVar10 = lVar8 + 0x8000 + (lVar8 >> 0x3f) >> 0x10;
            lVar11 = ((long)(short)((ushort)pbVar9[5] << 8) | (ulong)pbVar9[6]) * lVar11;
            FVar16 = lVar11 + 0x8000 + (lVar11 >> 0x3f) >> 0x10;
            lVar12 = ((long)(short)((ushort)pbVar9[7] << 8) | (ulong)pbVar9[8]) * lVar12;
            FVar15 = lVar12 + 0x8000 + (lVar12 >> 0x3f) >> 0x10;
            if (*pbVar9 == 2) {
              local_78.x = 0;
              local_78.y = 0;
              if ((byte *)((long)pvVar4 + (uVar5 - 4)) < pbVar9 + 9) {
                return '\0';
              }
              uVar2 = *(uint *)(pbVar9 + 9);
              get_deltas_for_var_index_base
                        (face,colr,
                         (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                uVar2 << 0x18),4,(FT_ItemVarDelta *)&local_78);
              pFVar6 = (face->root).size;
              lVar8 = (long)(int)(pFVar6->metrics).x_scale;
              lVar11 = (int)local_78.x * lVar8;
              FVar14 = FVar14 + (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
              lVar11 = (long)(int)(pFVar6->metrics).y_scale;
              lVar12 = local_78.x._4_4_ * lVar11;
              FVar10 = FVar10 + (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
              lVar8 = (int)local_78.y * lVar8;
              FVar16 = FVar16 + (int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
              lVar11 = local_78.y._4_4_ * lVar11;
              FVar15 = FVar15 + (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
            }
            local_78.x = FVar14;
            local_68 = FVar14;
            local_58 = FVar16;
            local_48 = FVar16;
            local_78.y = FVar10;
            FStack_60 = FVar15;
            FStack_50 = FVar15;
            FStack_40 = FVar10;
            lVar8 = 0;
            do {
              pFVar7 = (face->root).internal;
              if ((pFVar7->transform_flags & 1) != 0) {
                FT_Vector_Transform((FT_Vector *)((long)&local_78.x + lVar8),
                                    &pFVar7->transform_matrix);
              }
              pFVar7 = (face->root).internal;
              if ((pFVar7->transform_flags & 2) != 0) {
                plVar1 = (long *)((long)&local_78.x + lVar8);
                *plVar1 = *plVar1 + (pFVar7->transform_delta).x;
                plVar1 = (long *)((long)&local_78.y + lVar8);
                *plVar1 = *plVar1 + (pFVar7->transform_delta).y;
              }
              lVar8 = lVar8 + 0x10;
            } while (lVar8 != 0x40);
            (clip_box->bottom_left).x = local_78.x;
            (clip_box->bottom_left).y = local_78.y;
            (clip_box->top_left).x = local_68;
            (clip_box->top_left).y = FStack_60;
            (clip_box->top_right).x = local_58;
            (clip_box->top_right).y = FStack_50;
            (clip_box->bottom_right).x = local_48;
            (clip_box->bottom_right).y = FStack_40;
            return '\x01';
          }
          return '\0';
        }
        lVar8 = lVar8 + 7;
      } while ((uVar13 + (uVar13 == 0)) * 7 != lVar8);
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_color_glyph_clipbox( TT_Face      face,
                                   FT_UInt      base_glyph,
                                   FT_ClipBox*  clip_box )
  {
    Colr*  colr;

    FT_Byte  *p, *p1, *clip_base, *limit;

    FT_Byte    clip_list_format;
    FT_ULong   num_clip_boxes, i;
    FT_UShort  gid_start, gid_end;
    FT_UInt32  clip_box_offset;
    FT_Byte    format;

    const FT_Byte  num_corners = 4;
    FT_Vector      corners[4];
    FT_Byte        j;
    FT_BBox        font_clip_box;


    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    if ( !colr->clip_list )
      return 0;

    p = colr->clip_list;

    /* Limit points to the first byte after the end of the color table.    */
    /* Thus, in subsequent limit checks below we need to check whether the */
    /* read pointer is strictly greater than a position offset by certain  */
    /* field sizes to the left of that position.                           */
    limit = (FT_Byte*)colr->table + colr->table_size;

    /* Check whether we can extract one `uint8` and one `uint32`. */
    if ( p > limit - ( 1 + 4 ) )
      return 0;

    clip_base        = p;
    clip_list_format = FT_NEXT_BYTE ( p );

    /* Format byte used here to be able to upgrade ClipList for >16bit */
    /* glyph ids; for now we can expect it to be 1.                    */
    if ( !( clip_list_format == 1 ) )
      return 0;

    num_clip_boxes = FT_NEXT_ULONG( p );

    /* Check whether we can extract two `uint16` and one `Offset24`, */
    /* `num_clip_boxes` times.                                       */
    if ( colr->table_size / ( 2 + 2 + 3 ) < num_clip_boxes ||
         p > limit - ( 2 + 2 + 3 ) * num_clip_boxes        )
      return 0;

    for ( i = 0; i < num_clip_boxes; ++i )
    {
      gid_start       = FT_NEXT_USHORT( p );
      gid_end         = FT_NEXT_USHORT( p );
      clip_box_offset = FT_NEXT_UOFF3( p );

      if ( base_glyph >= gid_start && base_glyph <= gid_end )
      {
        p1 = (FT_Byte*)( clip_base + clip_box_offset );

        /* Check whether we can extract one `uint8`. */
        if ( p1 > limit - 1 )
          return 0;

        format = FT_NEXT_BYTE( p1 );

        if ( format > 2 )
          return 0;

        /* Check whether we can extract four `FWORD`. */
        if ( p1 > limit - ( 2 + 2 + 2 + 2 ) )
          return 0;

        /* `face->root.size->metrics.x_scale` and `y_scale` are factors   */
        /* that scale a font unit value in integers to a 26.6 fixed value */
        /* according to the requested size, see for example               */
        /* `ft_recompute_scaled_metrics`.                                 */
        font_clip_box.xMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );
        font_clip_box.xMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        if ( format == 2 )
        {
          FT_ULong         var_index_base = 0;
          /* varIndexBase offset for clipbox is 3 at most. */
          FT_ItemVarDelta  item_deltas[4] = { 0, 0, 0, 0 };


          /* Check whether we can extract a 32-bit varIndexBase now. */
          if ( p1 > limit - 4 )
            return 0;

          var_index_base = FT_NEXT_ULONG( p1 );

          if ( !get_deltas_for_var_index_base( face, colr, var_index_base, 4,
                                               item_deltas ) )
            return 0;

          font_clip_box.xMin +=
            FT_MulFix( item_deltas[0], face->root.size->metrics.x_scale );
          font_clip_box.yMin +=
            FT_MulFix( item_deltas[1], face->root.size->metrics.y_scale );
          font_clip_box.xMax +=
            FT_MulFix( item_deltas[2], face->root.size->metrics.x_scale );
          font_clip_box.yMax +=
            FT_MulFix( item_deltas[3], face->root.size->metrics.y_scale );
        }
#endif

        /* Make 4 corner points (xMin, yMin), (xMax, yMax) and transform */
        /* them.  If we we would only transform two corner points and    */
        /* span a rectangle based on those, the rectangle may become too */
        /* small to cover the glyph.                                     */
        corners[0].x = font_clip_box.xMin;
        corners[1].x = font_clip_box.xMin;
        corners[2].x = font_clip_box.xMax;
        corners[3].x = font_clip_box.xMax;

        corners[0].y = font_clip_box.yMin;
        corners[1].y = font_clip_box.yMax;
        corners[2].y = font_clip_box.yMax;
        corners[3].y = font_clip_box.yMin;

        for ( j = 0; j < num_corners; ++j )
        {
          if ( face->root.internal->transform_flags & 1 )
            FT_Vector_Transform( &corners[j],
                                 &face->root.internal->transform_matrix );

          if ( face->root.internal->transform_flags & 2 )
          {
            corners[j].x += face->root.internal->transform_delta.x;
            corners[j].y += face->root.internal->transform_delta.y;
          }
        }

        clip_box->bottom_left  = corners[0];
        clip_box->top_left     = corners[1];
        clip_box->top_right    = corners[2];
        clip_box->bottom_right = corners[3];

        return 1;
      }
    }

    return 0;
  }